

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O0

int FindAvailablePty(char *Slave)

{
  uint uVar1;
  char *__src;
  int res;
  char *Slave_local;
  
  Slave_local._4_4_ = posix_openpt(2);
  if (Slave_local._4_4_ < 0) {
    perror("open_pt failed");
    Slave_local._4_4_ = -1;
  }
  else {
    grantpt(Slave_local._4_4_);
    unlockpt(Slave_local._4_4_);
    __src = ptsname(Slave_local._4_4_);
    strcpy(Slave,__src);
    if (Slave_local._4_4_ == -1) {
      Slave_local._4_4_ = -1;
    }
    else {
      uVar1 = fcntl(Slave_local._4_4_,3,0);
      fcntl(Slave_local._4_4_,4,(ulong)(uVar1 | 0x800));
    }
  }
  return Slave_local._4_4_;
}

Assistant:

static int FindAvailablePty(char *Slave) {
  int res;

  res = posix_openpt(O_RDWR);
  if (res < 0) {
    perror("open_pt failed");
    return (-1);
  }
  grantpt(res);
  unlockpt(res);
  strcpy(Slave, ptsname(res));
  DBPRINT(("slave pty name is %s.\n", Slave));

  if (res != -1) {
    fcntl(res, F_SETFL, fcntl(res, F_GETFL, 0) | O_NONBLOCK);
    return (res);
  }
  return (-1);
}